

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCaseResult.hpp
# Opt level: O3

ValueInfo * __thiscall xe::ri::List::allocItem<xe::ri::ValueInfo>(List *this)

{
  ValueInfo *pVVar1;
  ValueInfo *local_18;
  
  std::vector<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>::reserve
            (&this->m_items,
             ((long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_items).
                    super__Vector_base<xe::ri::Item_*,_std::allocator<xe::ri::Item_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 1);
  pVVar1 = (ValueInfo *)operator_new(0x78);
  (pVVar1->super_Item).m_type = TYPE_VALUEINFO;
  (pVVar1->super_Item)._vptr_Item = (_func_int **)&PTR__ValueInfo_0012ea30;
  (pVVar1->name)._M_dataplus._M_p = (pointer)&(pVVar1->name).field_2;
  (pVVar1->name)._M_string_length = 0;
  (pVVar1->name).field_2._M_local_buf[0] = '\0';
  (pVVar1->description)._M_dataplus._M_p = (pointer)&(pVVar1->description).field_2;
  (pVVar1->description)._M_string_length = 0;
  (pVVar1->description).field_2._M_local_buf[0] = '\0';
  (pVVar1->unit)._M_dataplus._M_p = (pointer)&(pVVar1->unit).field_2;
  (pVVar1->unit)._M_string_length = 0;
  (pVVar1->unit).field_2._M_local_buf[0] = '\0';
  pVVar1->tag = VALUETAG_LAST;
  local_18 = pVVar1;
  std::vector<xe::ri::Item*,std::allocator<xe::ri::Item*>>::emplace_back<xe::ri::Item*>
            ((vector<xe::ri::Item*,std::allocator<xe::ri::Item*>> *)this,(Item **)&local_18);
  return pVVar1;
}

Assistant:

T* List::allocItem (void)
{
	m_items.reserve(m_items.size()+1);
	T* item = new T();
	m_items.push_back(static_cast<ri::Item*>(item));
	return item;
}